

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>
fmt::v8::detail::
write_nonfinite<char32_t,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>>
          (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> out,bool isinf,
          basic_format_specs<char32_t> specs,float_specs *fspecs)

{
  size_t sVar1;
  char32_t *pcVar2;
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> bVar3;
  bool local_89;
  char *local_88;
  char *local_80;
  char *local_78;
  anon_class_16_2_632e021f local_68;
  buffer<char32_t> *local_58;
  bool local_49;
  size_t sStack_48;
  bool is_zero_fill;
  size_t size;
  undefined8 uStack_38;
  sign_t sign;
  size_t str_size;
  char *str;
  float_specs *fspecs_local;
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> bStack_18;
  bool isinf_local;
  back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> out_local;
  
  if (isinf) {
    if ((*(uint *)&fspecs->field_0x4 >> 0x10 & 1) == 0) {
      local_78 = "inf";
    }
    else {
      local_78 = "INF";
    }
    local_80 = local_78;
  }
  else {
    if ((*(uint *)&fspecs->field_0x4 >> 0x10 & 1) == 0) {
      local_88 = "nan";
    }
    else {
      local_88 = "NAN";
    }
    local_80 = local_88;
  }
  str_size = (size_t)local_80;
  uStack_38 = 3;
  size._4_4_ = *(uint *)&fspecs->field_0x4 >> 8 & 0xff;
  sStack_48 = (long)(int)(uint)(size._4_4_ != none) + 3;
  str = (char *)fspecs;
  fspecs_local._7_1_ = isinf;
  bStack_18.container = out.container;
  sVar1 = fill_t<char32_t>::size(&specs.fill);
  local_89 = false;
  if (sVar1 == 1) {
    pcVar2 = fill_t<char32_t>::data(&specs.fill);
    local_89 = *pcVar2 == L'0';
  }
  local_49 = local_89;
  if (local_89 != false) {
    pcVar2 = fill_t<char32_t>::operator[](&specs.fill,0);
    *pcVar2 = L' ';
  }
  local_58 = bStack_18.container;
  local_68.sign = size._4_4_;
  local_68.str = (char *)str_size;
  bVar3 = write_padded<(fmt::v8::align::type)1,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,char32_t,fmt::v8::detail::write_nonfinite<char32_t,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>>(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,bool,fmt::v8::basic_format_specs<char32_t>,fmt::v8::detail::float_specs_const&)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>)_1_>
                    (bStack_18,&specs,sStack_48,&local_68);
  return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)bVar3.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_nonfinite(OutputIt out, bool isinf,
                                     basic_format_specs<Char> specs,
                                     const float_specs& fspecs) -> OutputIt {
  auto str =
      isinf ? (fspecs.upper ? "INF" : "inf") : (fspecs.upper ? "NAN" : "nan");
  constexpr size_t str_size = 3;
  auto sign = fspecs.sign;
  auto size = str_size + (sign ? 1 : 0);
  // Replace '0'-padding with space for non-finite values.
  const bool is_zero_fill =
      specs.fill.size() == 1 && *specs.fill.data() == static_cast<Char>('0');
  if (is_zero_fill) specs.fill[0] = static_cast<Char>(' ');
  return write_padded(out, specs, size, [=](reserve_iterator<OutputIt> it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    return copy_str<Char>(str, str + str_size, it);
  });
}